

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjDestroy(tjhandle handle)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  tjinstance *this;
  long in_FS_OFFSET;
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)(in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    *(undefined8 *)(in_FS_OFFSET + -0xd0) = 0x2064696c61766e49;
    iVar3 = -1;
  }
  else {
    *(undefined4 *)((long)handle + 0x5f8) = 0;
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    iVar3 = -1;
    if (iVar2 == 0) {
      uVar1 = *(uint *)((long)handle + 0x600);
      if ((uVar1 & 1) != 0) {
        jpeg_destroy_compress((j_compress_ptr)handle);
        uVar1 = *(uint *)((long)handle + 0x600);
      }
      if ((uVar1 & 2) != 0) {
        jpeg_destroy_decompress((j_decompress_ptr)((long)handle + 0x208));
      }
      free(handle);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

DLLEXPORT int tjDestroy(tjhandle handle)
{
  GET_INSTANCE(handle);

  if (setjmp(this->jerr.setjmp_buffer)) return -1;
  if (this->init & COMPRESS) jpeg_destroy_compress(cinfo);
  if (this->init & DECOMPRESS) jpeg_destroy_decompress(dinfo);
  free(this);
  return 0;
}